

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O2

Dec_Node_t * Dec_GraphAppendNode(Dec_Graph_t *pGraph)

{
  Dec_Node_t *pDVar1;
  int iVar2;
  Dec_Node_t *__ptr;
  int iVar3;
  
  iVar3 = pGraph->nSize;
  __ptr = pGraph->pNodes;
  if (iVar3 == pGraph->nCap) {
    if (__ptr == (Dec_Node_t *)0x0) {
      __ptr = (Dec_Node_t *)malloc((long)iVar3 * 0x30);
      iVar2 = iVar3;
    }
    else {
      __ptr = (Dec_Node_t *)realloc(__ptr,(long)iVar3 * 0x30);
      iVar3 = pGraph->nSize;
      iVar2 = pGraph->nCap;
    }
    pGraph->pNodes = __ptr;
    pGraph->nCap = iVar2 * 2;
  }
  pGraph->nSize = iVar3 + 1;
  pDVar1 = __ptr + iVar3;
  pDVar1->eEdge0 = (Dec_Edge_t)0x0;
  pDVar1->eEdge1 = (Dec_Edge_t)0x0;
  (pDVar1->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&__ptr[iVar3].field_0x10 = 0;
  return __ptr + iVar3;
}

Assistant:

static inline Dec_Node_t * Dec_GraphAppendNode( Dec_Graph_t * pGraph )   
{
    Dec_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Dec_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Dec_Node_t) );
    return pNode;
}